

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_midi.c
# Opt level: O3

void inmidi_controlchange(int portno,int channel,int ctlnumber,int value)

{
  t_atom at [3];
  t_atom local_38;
  undefined4 local_28;
  float local_20;
  undefined4 local_18;
  float local_10;
  
  if (*(t_pd **)(*(long *)(pd_maininstance.pd_midi + 0x18) + 8) != (t_pd *)0x0) {
    local_38.a_type = A_FLOAT;
    local_38.a_w.w_float = (t_float)ctlnumber;
    local_28 = 1;
    local_20 = (float)value;
    local_18 = 1;
    local_10 = (float)(portno * 0x10 + channel + 1);
    pd_list(*(t_pd **)(*(long *)(pd_maininstance.pd_midi + 0x18) + 8),&s_list,3,&local_38);
  }
  return;
}

Assistant:

void inmidi_controlchange(int portno, int channel, int ctlnumber, int value)
{
    if (pd_this->pd_midi->m_ctlin_sym->s_thing)
    {
        t_atom at[3];
        SETFLOAT(at, ctlnumber);
        SETFLOAT(at+1, value);
        SETFLOAT(at+2, (channel + (portno << 4) + 1));
        pd_list(pd_this->pd_midi->m_ctlin_sym->s_thing, &s_list, 3, at);
    }
}